

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_auth_act(Curl_easy *data)

{
  undefined1 *puVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  connectdata *conn;
  _Bool _Var5;
  _Bool _Var6;
  CURLcode CVar7;
  char *pcVar8;
  
  pcVar8 = (data->set).str[0x40];
  iVar3 = (data->req).httpcode;
  if (iVar3 - 100U < 100) {
    return CURLE_OK;
  }
  if (((data->state).field_0x6d0 & 0x20) != 0) {
    if (((data->set).field_0x8e4 & 2) == 0) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  conn = data->conn;
  if (pcVar8 == (char *)0x0 && (data->state).aptr.user == (char *)0x0) {
    _Var5 = false;
  }
  else {
    if (iVar3 != 0x191) {
      _Var5 = false;
      if ((299 < iVar3) || (_Var5 = false, (*(uint *)&(conn->bits).field_0x4 & 0x10000) == 0))
      goto LAB_0055b95a;
    }
    _Var5 = pickoneauth(&(data->state).authhost,-(ulong)(pcVar8 != (char *)0x0) | 0xffffffffffffffbf
                       );
    if (!_Var5) {
      puVar1 = &(data->state).field_0x6d0;
      *puVar1 = *puVar1 | 0x20;
    }
    if (((data->state).authhost.picked == 8) && (0xb < conn->httpversion)) {
      Curl_infof(data,"Forcing HTTP/1.1 for NTLM");
      Curl_conncontrol(conn,1);
      (data->state).httpwant = '\x02';
    }
  }
LAB_0055b95a:
  uVar4 = *(uint *)&(conn->bits).field_0x4;
  if (((uVar4 & 4) == 0) ||
     ((iVar3 = (data->req).httpcode, iVar3 != 0x197 && (299 < iVar3 || (uVar4 >> 0x10 & 1) == 0))))
  {
    _Var6 = false;
  }
  else {
    _Var6 = pickoneauth(&(data->state).authproxy,0xffffffffffffffbf);
    if (!_Var6) {
      puVar1 = &(data->state).field_0x6d0;
      *puVar1 = *puVar1 | 0x20;
    }
  }
  if ((_Var5 | _Var6) == 1) {
    uVar2 = (data->state).httpreq;
    if (((uVar2 != '\0') && (uVar2 != '\x05')) &&
       ((((conn->bits).field_0x6 & 2) == 0 &&
        (CVar7 = http_perhapsrewind(data,conn), CVar7 != CURLE_OK)))) {
      return CVar7;
    }
    (*Curl_cfree)((data->req).newurl);
    (data->req).newurl = (char *)0x0;
    pcVar8 = (*Curl_cstrdup)((data->state).url);
    (data->req).newurl = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else if (((((data->req).httpcode < 300) && (((data->state).authhost.field_0x18 & 1) == 0)) &&
           (((conn->bits).field_0x6 & 1) != 0)) &&
          ((uVar2 = (data->state).httpreq, uVar2 != '\0' && (uVar2 != '\x05')))) {
    pcVar8 = (*Curl_cstrdup)((data->state).url);
    (data->req).newurl = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(data->state).authhost.field_0x18;
    *puVar1 = *puVar1 | 1;
  }
  _Var5 = http_should_fail(data);
  CVar7 = CURLE_OK;
  if (_Var5) {
    Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
    CVar7 = CURLE_HTTP_RETURNED_ERROR;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_http_auth_act(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;
  unsigned long authmask = ~0ul;

  if(!data->set.str[STRING_BEARER])
    authmask &= (unsigned long)~CURLAUTH_BEARER;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if((data->state.aptr.user || data->set.str[STRING_BEARER]) &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost, authmask);
    if(!pickhost)
      data->state.authproblem = TRUE;
    if(data->state.authhost.picked == CURLAUTH_NTLM &&
       conn->httpversion > 11) {
      infof(data, "Forcing HTTP/1.1 for NTLM");
      connclose(conn, "Force HTTP/1.1 connection");
      data->state.httpwant = CURL_HTTP_VERSION_1_1;
    }
  }
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy,
                            authmask & ~CURLAUTH_BEARER);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }
#endif

  if(pickhost || pickproxy) {
    if((data->state.httpreq != HTTPREQ_GET) &&
       (data->state.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(data, conn);
      if(result)
        return result;
    }
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->state.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->state.httpreq != HTTPREQ_GET) &&
       (data->state.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->state.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(data)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}